

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::LargeHeapBlock::LargeHeapBlock
          (LargeHeapBlock *this,char *address,size_t pageCount,Segment *segment,uint objectCount,
          LargeHeapBucket *bucket)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  (this->super_HeapBlock).heapBlockType = LargeBlockType;
  (this->super_HeapBlock).needOOMRescan = false;
  (this->super_HeapBlock)._vptr_HeapBlock = (_func_int **)&PTR_WBSetBit_014ee7e0;
  this->pageCount = pageCount;
  this->objectCount = objectCount;
  this->allocAddressEnd = address;
  this->bucket = bucket;
  (this->freeList).previous = (LargeHeapBlockFreeList *)0x0;
  (this->freeList).next = (LargeHeapBlockFreeList *)0x0;
  (this->freeList).entries = (LargeHeapBlockFreeListEntry *)0x0;
  (this->freeList).heapBlock = this;
  (this->wbVerifyBits).head = (Type_conflict)0x0;
  (this->wbVerifyBits).lastFoundIndex = (Type_conflict)0x0;
  (this->wbVerifyBits).alloc = &HeapAllocator::Instance;
  (this->wbVerifyBits).lastUsedNodePrevNextField = &(this->wbVerifyBits).head;
  if (address == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0xb5,"(address != nullptr)","address != nullptr");
    if (!bVar2) goto LAB_006f0444;
    *puVar3 = 0;
  }
  if (pageCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0xb6,"(pageCount != 0)","pageCount != 0");
    if (!bVar2) goto LAB_006f0444;
    *puVar3 = 0;
  }
  if (objectCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0xb7,"(objectCount != 0)","objectCount != 0");
    if (!bVar2) goto LAB_006f0444;
    *puVar3 = 0;
  }
  if (this->lastCollectAllocCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0xb8,"(lastCollectAllocCount == 0)","lastCollectAllocCount == 0");
    if (!bVar2) goto LAB_006f0444;
    *puVar3 = 0;
  }
  if (this->finalizeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0xb9,"(finalizeCount == 0)","finalizeCount == 0");
    if (!bVar2) goto LAB_006f0444;
    *puVar3 = 0;
  }
  if (this->next != (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0xba,"(next == nullptr)","next == nullptr");
    if (!bVar2) goto LAB_006f0444;
    *puVar3 = 0;
  }
  if (this->hasPartialFreeObjects == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0xbb,"(!hasPartialFreeObjects)","!hasPartialFreeObjects");
    if (!bVar2) {
LAB_006f0444:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_HeapBlock).address = address;
  (this->super_HeapBlock).segment = segment;
  (this->super_HeapBlock).isPendingConcurrentSweep = false;
  this->addressEnd = address + this->pageCount * 0x1000;
  return;
}

Assistant:

LargeHeapBlock::LargeHeapBlock(__in char * address, size_t pageCount, Segment * segment, uint objectCount, LargeHeapBucket* bucket)
    : HeapBlock(LargeBlockType), pageCount(pageCount), allocAddressEnd(address), objectCount(objectCount), bucket(bucket), freeList(this)
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    ,wbVerifyBits(&HeapAllocator::Instance)
#endif
{
    Assert(address != nullptr);
    Assert(pageCount != 0);
    Assert(objectCount != 0);
    Assert(lastCollectAllocCount == 0);
    Assert(finalizeCount == 0);
    Assert(next == nullptr);
    Assert(!hasPartialFreeObjects);

    this->address = address;
    this->segment = segment;
#if ENABLE_CONCURRENT_GC
    this->isPendingConcurrentSweep = false;
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    // This flag is to identify whether this block was made available for allocations during the concurrent sweep and still needs to be swept.
    this->isPendingConcurrentSweepPrep = false;
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
    this->wasAllocatedFromDuringSweep = false;
#endif
#endif
#endif
    this->addressEnd = this->address + this->pageCount * AutoSystemInfo::PageSize;

    RECYCLER_PERF_COUNTER_INC(LargeHeapBlockCount);
    RECYCLER_PERF_COUNTER_ADD(LargeHeapBlockPageSize, pageCount * AutoSystemInfo::PageSize);
}